

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

optional<std::array<int,_4UL>_> * __thiscall
tinyusdz::Attribute::get_value<std::array<int,4ul>>
          (optional<std::array<int,_4UL>_> *__return_storage_ptr__,Attribute *this)

{
  optional<std::array<int,_4UL>_> local_24;
  
  primvar::PrimVar::get_value<std::array<int,4ul>>(&local_24,&this->_var);
  __return_storage_ptr__->has_value_ = local_24.has_value_;
  if (local_24.has_value_ == true) {
    *(undefined8 *)&__return_storage_ptr__->contained = local_24.contained._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = local_24.contained._8_8_;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return _var.get_value<T>();
  }